

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

void duckdb::TernaryExecutor::
     ExecuteLoop<duckdb::string_t,duckdb::dtime_t,duckdb::dtime_t,long,duckdb::TernaryLambdaWrapperWithNulls,long(*)(duckdb::string_t,duckdb::dtime_t,duckdb::dtime_t,duckdb::ValidityMask&,unsigned_long)>
               (string_t *adata,dtime_t *bdata,dtime_t *cdata,long *result_data,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,
               _func_long_string_t_dtime_t_dtime_t_ValidityMask_ptr_unsigned_long *fun)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  unsigned_long uVar6;
  long lVar7;
  ulong uVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  unsigned_long uVar10;
  ulong uVar11;
  unsigned_long uVar12;
  ulong uVar13;
  idx_t idx_in_entry;
  unsigned_long uVar14;
  ulong uVar15;
  string_t sVar16;
  string_t sVar17;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  if ((((avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) &&
      ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      )) && ((cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
             (unsigned_long *)0x0)) {
    if (count != 0) {
      uVar14 = 0;
      do {
        uVar6 = uVar14;
        if (asel->sel_vector != (sel_t *)0x0) {
          uVar6 = (unsigned_long)asel->sel_vector[uVar14];
        }
        uVar10 = uVar14;
        if (bsel->sel_vector != (sel_t *)0x0) {
          uVar10 = (unsigned_long)bsel->sel_vector[uVar14];
        }
        uVar12 = uVar14;
        if (csel->sel_vector != (sel_t *)0x0) {
          uVar12 = (unsigned_long)csel->sel_vector[uVar14];
        }
        sVar16.value.pointer.ptr = adata[uVar6].value.pointer.ptr;
        sVar16.value._0_8_ = *(undefined8 *)&adata[uVar6].value;
        lVar7 = (*fun)(sVar16,(dtime_t)bdata[uVar10].micros,(dtime_t)cdata[uVar12].micros,
                       result_validity,uVar14);
        result_data[uVar14] = lVar7;
        uVar14 = uVar14 + 1;
      } while (count != uVar14);
    }
  }
  else if (count != 0) {
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar15 = 0;
    do {
      uVar8 = uVar15;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)asel->sel_vector[uVar15];
      }
      uVar11 = uVar15;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar11 = (ulong)bsel->sel_vector[uVar15];
      }
      uVar13 = uVar15;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)csel->sel_vector[uVar15];
      }
      puVar2 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0))
          && ((puVar2 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
              puVar2 == (unsigned_long *)0x0 || ((puVar2[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0))
             )) && ((puVar2 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
                    puVar2 == (unsigned_long *)0x0 ||
                    ((puVar2[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)))) {
        sVar17.value.pointer.ptr = adata[uVar8].value.pointer.ptr;
        sVar17.value._0_8_ = *(undefined8 *)&adata[uVar8].value;
        lVar7 = (*fun)(sVar17,(dtime_t)bdata[uVar11].micros,(dtime_t)cdata[uVar13].micros,
                       result_validity,uVar15);
        result_data[uVar15] = lVar7;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var5 = p_Stack_50;
          peVar4 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar4;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var5;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_40);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar3 = (byte)uVar15 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar15 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      uVar15 = uVar15 + 1;
    } while (count != uVar15);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}